

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_disable_debug_mode(void)

{
  event_debug_entry **ppeVar1;
  event_debug_entry *ptr;
  event *peVar2;
  ulong uVar3;
  event_debug_entry **ppeVar4;
  uint uVar5;
  event_debug_entry **ppeVar6;
  bool bVar7;
  
  if (event_debug_map_lock_ != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
  }
  uVar3 = (ulong)global_debug_map.hth_table_length;
  ppeVar4 = global_debug_map.hth_table + -1;
  do {
    bVar7 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar7) {
      ppeVar6 = (event_debug_entry **)0x0;
      break;
    }
    ppeVar6 = ppeVar4 + 1;
    ppeVar1 = ppeVar4 + 1;
    ppeVar4 = ppeVar6;
  } while (*ppeVar1 == (event_debug_entry *)0x0);
  do {
    if (ppeVar6 == (event_debug_entry **)0x0) {
      event_debug_map_HT_CLEAR(&global_debug_map);
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
      }
      event_debug_mode_on_ = 0;
      return;
    }
    ptr = *ppeVar6;
    peVar2 = ptr->ptr;
    *ppeVar6 = (ptr->node).hte_next;
    global_debug_map.hth_n_entries = global_debug_map.hth_n_entries - 1;
    if (*ppeVar6 == (event_debug_entry *)0x0) {
      uVar3 = ((ulong)peVar2 >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length;
      do {
        uVar5 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar5;
        if (global_debug_map.hth_table_length <= uVar5) {
          ppeVar6 = (event_debug_entry **)0x0;
          goto LAB_002626b1;
        }
      } while (global_debug_map.hth_table[uVar5] == (event_debug_entry *)0x0);
      ppeVar6 = global_debug_map.hth_table + uVar5;
    }
LAB_002626b1:
    event_mm_free_(ptr);
  } while( true );
}

Assistant:

void
event_disable_debug_mode(void)
{
#ifndef EVENT__DISABLE_DEBUG_MODE
	struct event_debug_entry **ent, *victim;

	EVLOCK_LOCK(event_debug_map_lock_, 0);
	for (ent = HT_START(event_debug_map, &global_debug_map); ent; ) {
		victim = *ent;
		ent = HT_NEXT_RMV(event_debug_map, &global_debug_map, ent);
		mm_free(victim);
	}
	HT_CLEAR(event_debug_map, &global_debug_map);
	EVLOCK_UNLOCK(event_debug_map_lock_ , 0);

	event_debug_mode_on_  = 0;
#endif
}